

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::generateConfig
          (IterationConfig *__return_storage_ptr__,LineRenderCase *this,int iteration,
          IVec2 *renderTargetSize)

{
  uint uVar1;
  float fVar2;
  IterationConfig local_70;
  
  uVar1 = 0;
  while( true ) {
    BBoxRenderCase::generateRandomConfig
              (&local_70,&this->super_BBoxRenderCase,uVar1 ^ iteration * 0xdedede,renderTargetSize);
    fVar2 = (float)this->m_wideLineLineWidth *
            (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4 * 2.5;
    if ((fVar2 < local_70.patternSize.m_data[0] * 0.5 * (float)local_70.viewportSize.m_data[0]) &&
       (fVar2 < local_70.patternSize.m_data[1] * 0.5 * (float)local_70.viewportSize.m_data[1]))
    break;
    uVar1 = uVar1 + 0xabab13;
    if (uVar1 == 0x55d58980) {
      (__return_storage_ptr__->bbox).max.m_data[0] = 0.0;
      (__return_storage_ptr__->bbox).max.m_data[1] = 0.0;
      (__return_storage_ptr__->bbox).max.m_data[2] = 0.0;
      (__return_storage_ptr__->bbox).max.m_data[3] = 0.0;
      (__return_storage_ptr__->bbox).min.m_data[0] = 0.0;
      (__return_storage_ptr__->bbox).min.m_data[1] = 0.0;
      (__return_storage_ptr__->bbox).min.m_data[2] = 0.0;
      (__return_storage_ptr__->bbox).min.m_data[3] = 0.0;
      *(undefined8 *)(__return_storage_ptr__->patternPos).m_data = 0;
      *(undefined8 *)(__return_storage_ptr__->patternSize).m_data = 0;
      *(undefined8 *)(__return_storage_ptr__->viewportPos).m_data = 0;
      *(undefined8 *)(__return_storage_ptr__->viewportSize).m_data = 0;
      return __return_storage_ptr__;
    }
  }
  *&(__return_storage_ptr__->viewportPos).m_data = local_70.viewportPos.m_data;
  *(ulong *)(__return_storage_ptr__->viewportSize).m_data =
       CONCAT44(local_70.viewportSize.m_data[1],local_70.viewportSize.m_data[0]);
  *&(__return_storage_ptr__->patternPos).m_data = local_70.patternPos.m_data;
  *(ulong *)(__return_storage_ptr__->patternSize).m_data =
       CONCAT44(local_70.patternSize.m_data[1],local_70.patternSize.m_data[0]);
  *(undefined8 *)(__return_storage_ptr__->bbox).min.m_data = local_70.bbox.min.m_data._0_8_;
  *(undefined8 *)((__return_storage_ptr__->bbox).min.m_data + 2) = local_70.bbox.min.m_data._8_8_;
  *(undefined8 *)(__return_storage_ptr__->bbox).max.m_data = local_70.bbox.max.m_data._0_8_;
  *(undefined8 *)((__return_storage_ptr__->bbox).max.m_data + 2) = local_70.bbox.max.m_data._8_8_;
  return __return_storage_ptr__;
}

Assistant:

LineRenderCase::IterationConfig LineRenderCase::generateConfig (int iteration, const tcu::IVec2& renderTargetSize) const
{
	const int numMaxAttempts = 128;

	// Avoid too narrow viewports, lines could merge together. Require viewport is at least 2.5x the size of the line bodies.
	for (int attemptNdx = 0; attemptNdx < numMaxAttempts; ++attemptNdx)
	{
		const IterationConfig& config = generateRandomConfig((0xDEDEDEu * (deUint32)iteration) ^ (0xABAB13 * attemptNdx), renderTargetSize);

		if ((float)config.viewportSize.x() * (config.patternSize.x() * 0.5f) > 2.5f * (float)m_patternSide * (float)m_wideLineLineWidth &&
			(float)config.viewportSize.y() * (config.patternSize.y() * 0.5f) > 2.5f * (float)m_patternSide * (float)m_wideLineLineWidth)
		{
			return config;
		}
	}

	DE_ASSERT(false);
	return IterationConfig();
}